

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

SpatialAcc *
iDynTree::convertMixedAccelerationToBodyFixedAcceleration
          (Vector6 *mixedAcc,Twist *bodyFixedVel,Rotation *inertial_R_body)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  SpatialAcc *bodyFixedAcc;
  SpatialAcc *in_RDI;
  
  dVar1 = *(double *)bodyFixedVel;
  dVar2 = *(double *)(bodyFixedVel + 0x18);
  dVar9 = *(double *)(bodyFixedVel + 0x20);
  dVar10 = *(double *)(bodyFixedVel + 0x28);
  dVar11 = *(double *)(bodyFixedVel + 8);
  dVar12 = *(double *)(bodyFixedVel + 0x10);
  dVar13 = *(double *)inertial_R_body;
  dVar14 = *(double *)(inertial_R_body + 8);
  dVar3 = mixedAcc->m_data[0];
  dVar4 = mixedAcc->m_data[1];
  dVar15 = *(double *)(inertial_R_body + 0x18);
  dVar16 = *(double *)(inertial_R_body + 0x20);
  dVar17 = *(double *)(inertial_R_body + 0x30);
  dVar18 = *(double *)(inertial_R_body + 0x38);
  dVar5 = mixedAcc->m_data[2];
  dVar6 = *(double *)(inertial_R_body + 0x10);
  dVar7 = *(double *)(inertial_R_body + 0x28);
  dVar8 = *(double *)(inertial_R_body + 0x40);
  (in_RDI->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
  super_Vector3.m_data[0] =
       (dVar5 * dVar17 + dVar4 * dVar15 + dVar3 * dVar13) - (dVar12 * dVar9 - dVar10 * dVar11);
  (in_RDI->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
  super_Vector3.m_data[1] =
       (dVar5 * dVar18 + dVar4 * dVar16 + dVar3 * dVar14) - (dVar1 * dVar10 - dVar2 * dVar12);
  (in_RDI->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.
  super_Vector3.m_data[2] =
       (dVar5 * dVar8 + dVar4 * dVar7 + dVar3 * dVar6) - (dVar2 * dVar11 - dVar1 * dVar9);
  dVar1 = mixedAcc->m_data[3];
  dVar2 = mixedAcc->m_data[4];
  dVar3 = mixedAcc->m_data[5];
  (in_RDI->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
  .super_Vector3.m_data[0] = dVar3 * dVar17 + dVar2 * dVar15 + dVar1 * dVar13;
  (in_RDI->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
  .super_Vector3.m_data[1] = dVar3 * dVar18 + dVar2 * dVar16 + dVar1 * dVar14;
  (in_RDI->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3
  .super_Vector3.m_data[2] = dVar8 * dVar3 + dVar7 * dVar2 + dVar6 * dVar1;
  return in_RDI;
}

Assistant:

SpatialAcc convertMixedAccelerationToBodyFixedAcceleration(const Vector6 & mixedAcc,
                                                           const Twist & bodyFixedVel,
                                                           const Rotation & inertial_R_body)
{
    SpatialAcc bodyFixedAcc;

    Eigen::Map<const Eigen::Vector3d> linMixedAcc(mixedAcc.data());
    Eigen::Map<const Eigen::Vector3d> angMixedAcc(mixedAcc.data()+3);

    Eigen::Map<const Eigen::Vector3d> linBodyFixedTwist(bodyFixedVel.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angBodyFixedTwist(bodyFixedVel.getAngularVec3().data());

    Eigen::Map<const Matrix3dRowMajor> inertial_R_body_eig(inertial_R_body.data());

    Eigen::Map<Eigen::Vector3d> linBodyFixedAcc(bodyFixedAcc.getLinearVec3().data());
    Eigen::Map<Eigen::Vector3d> angBodyFixedAcc(bodyFixedAcc.getAngularVec3().data());

    linBodyFixedAcc = inertial_R_body_eig.transpose()*linMixedAcc - angBodyFixedTwist.cross(linBodyFixedTwist);
    angBodyFixedAcc = inertial_R_body_eig.transpose()*angMixedAcc;

    return bodyFixedAcc;
}